

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collider.cxx
# Opt level: O1

void __thiscall trento::Collider::Collider(Collider *this,VarMap *var_map)

{
  bool bVar1;
  int iVar2;
  _Head_base<0UL,_trento::Nucleus_*,_false> _Var3;
  Nucleus *pNVar4;
  undefined8 uVar5;
  any *paVar6;
  int *piVar7;
  bool *pbVar8;
  double *pdVar9;
  ulong *puVar10;
  long lVar11;
  pointer *__ptr_1;
  ulong uVar12;
  pointer *__ptr;
  double dVar13;
  double dVar14;
  double dVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined4 *local_50;
  undefined8 local_48;
  undefined4 local_40;
  undefined2 local_3c;
  
  anon_unknown_6::create_nucleus((anon_unknown_6 *)this,var_map,0);
  anon_unknown_6::create_nucleus((anon_unknown_6 *)&this->nucleusB_,var_map,1);
  NucleonCommon::NucleonCommon(&this->nucleon_common_,var_map);
  local_50 = &local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"number-events","");
  paVar6 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)var_map);
  piVar7 = boost::any_cast<int_const&>(paVar6);
  iVar2 = *piVar7;
  if (local_50 != &local_40) {
    operator_delete(local_50);
  }
  this->nevents_ = iVar2;
  local_50 = &local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"ncoll","");
  paVar6 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)var_map);
  pbVar8 = boost::any_cast<bool_const&>(paVar6);
  bVar1 = *pbVar8;
  if (local_50 != &local_40) {
    operator_delete(local_50);
  }
  this->calc_ncoll_ = bVar1;
  local_50 = &local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"b-min","");
  paVar6 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)var_map);
  pdVar9 = boost::any_cast<double_const&>(paVar6);
  dVar14 = *pdVar9;
  if (local_50 != &local_40) {
    operator_delete(local_50);
  }
  this->bmin_ = dVar14;
  _Var3._M_head_impl =
       (this->nucleusA_)._M_t.
       super___uniq_ptr_impl<trento::Nucleus,_std::default_delete<trento::Nucleus>_>._M_t.
       super__Tuple_impl<0UL,_trento::Nucleus_*,_std::default_delete<trento::Nucleus>_>.
       super__Head_base<0UL,_trento::Nucleus_*,_false>._M_head_impl;
  pNVar4 = (this->nucleusB_)._M_t.
           super___uniq_ptr_impl<trento::Nucleus,_std::default_delete<trento::Nucleus>_>._M_t.
           super__Tuple_impl<0UL,_trento::Nucleus_*,_std::default_delete<trento::Nucleus>_>.
           super__Head_base<0UL,_trento::Nucleus_*,_false>._M_head_impl;
  local_40 = 0x616d2d62;
  local_3c = 0x78;
  local_48 = 5;
  local_50 = &local_40;
  paVar6 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)var_map);
  pdVar9 = boost::any_cast<double_const&>(paVar6);
  dVar14 = *pdVar9;
  if (local_50 != &local_40) {
    operator_delete(local_50);
  }
  if (dVar14 < 0.0) {
    dVar13 = (double)(**(code **)((long)(_Var3._M_head_impl)->_vptr_Nucleus + 0x10))
                               (_Var3._M_head_impl);
    dVar15 = dVar13;
    (*pNVar4->_vptr_Nucleus[2])(pNVar4);
    dVar14 = (this->nucleon_common_).max_impact_sq_;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = dVar14;
    if (dVar14 < 0.0) {
      dVar14 = sqrt(dVar14);
    }
    else {
      auVar16 = vsqrtsd_avx(auVar16,auVar16);
      dVar14 = auVar16._0_8_;
    }
    dVar14 = dVar15 + dVar13 + dVar14;
  }
  this->bmax_ = dVar14;
  pNVar4 = (this->nucleusB_)._M_t.
           super___uniq_ptr_impl<trento::Nucleus,_std::default_delete<trento::Nucleus>_>._M_t.
           super__Tuple_impl<0UL,_trento::Nucleus_*,_std::default_delete<trento::Nucleus>_>.
           super__Head_base<0UL,_trento::Nucleus_*,_false>._M_head_impl;
  dVar15 = (double)(**(code **)((long)((this->nucleusA_)._M_t.
                                       super___uniq_ptr_impl<trento::Nucleus,_std::default_delete<trento::Nucleus>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_trento::Nucleus_*,_std::default_delete<trento::Nucleus>_>
                                       .super__Head_base<0UL,_trento::Nucleus_*,_false>._M_head_impl
                                      )->_vptr_Nucleus + 0x10))();
  dVar14 = dVar15;
  (*pNVar4->_vptr_Nucleus[2])(pNVar4);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = dVar15 + dVar14;
  uVar5 = vcmpsd_avx512f(auVar17,ZEXT816(0x3fb999999999999a),1);
  bVar1 = (bool)((byte)uVar5 & 1);
  this->asymmetry_ =
       (double)((ulong)bVar1 * 0x3fe0000000000000 +
               (ulong)!bVar1 * (long)(dVar15 / (dVar15 + dVar14)));
  Event::Event(&this->event_,var_map);
  Output::Output(&this->output_,var_map);
  local_50 = &local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"random-seed","");
  paVar6 = (any *)boost::program_options::abstract_variables_map::operator[]((string *)var_map);
  puVar10 = (ulong *)boost::any_cast<long_const&>(paVar6);
  uVar12 = *puVar10;
  if (local_50 != &local_40) {
    operator_delete(local_50);
  }
  if (0 < (long)uVar12) {
    lVar11 = 1;
    random::engine = uVar12;
    do {
      uVar12 = (uVar12 >> 0x3e ^ uVar12) * 0x5851f42d4c957f2d + lVar11;
      (&random::engine)[lVar11] = uVar12;
      lVar11 = lVar11 + 1;
    } while (lVar11 != 0x138);
    DAT_00133f78 = 0x138;
  }
  return;
}

Assistant:

Collider::Collider(const VarMap& var_map)
    : nucleusA_(create_nucleus(var_map, 0)),
      nucleusB_(create_nucleus(var_map, 1)),
      nucleon_common_(var_map),
      nevents_(var_map["number-events"].as<int>()),
      calc_ncoll_(var_map["ncoll"].as<bool>()),
      bmin_(var_map["b-min"].as<double>()),
      bmax_(determine_bmax(var_map, *nucleusA_, *nucleusB_, nucleon_common_)),
      asymmetry_(determine_asym(*nucleusA_, *nucleusB_)),
      event_(var_map),
      output_(var_map) {
  // Constructor body begins here.
  // Set random seed if requested.
  auto seed = var_map["random-seed"].as<int64_t>();
  if (seed > 0)
    random::engine.seed(static_cast<random::Engine::result_type>(seed));
}